

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O2

vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_> *
__thiscall
soinn::ESOINN::getCenterOfCluster
          (vector<double,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
           *__return_storage_ptr__,ESOINN *this,int classId)

{
  long lVar1;
  _List_node_base *p_Var2;
  long in_RAX;
  StoredVertex *sv;
  _List_node_base *p_Var3;
  StoredVertexList *pSVar4;
  double dVar5;
  
  pSVar4 = &(this->graph).super_type.m_vertices;
  dVar5 = -1.0;
  p_Var2 = (this->graph).super_type.m_vertices.super__List_base<void_*,_std::allocator<void_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  while (p_Var3 = p_Var2, p_Var3 != (_List_node_base *)pSVar4) {
    for (; p_Var2 = (_List_node_base *)pSVar4, p_Var3 != (_List_node_base *)pSVar4;
        p_Var3 = p_Var3->_M_next) {
      lVar1 = (long)p_Var3[1]._M_next;
      if ((*(int *)(lVar1 + 0x38) == classId) && (dVar5 < *(double *)(lVar1 + 0x40))) {
        in_RAX = lVar1;
        dVar5 = *(double *)(lVar1 + 0x40);
      }
    }
  }
  boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::unbounded_array
            (&__return_storage_ptr__->data_,
             (unbounded_array<double,_std::allocator<double>_> *)(in_RAX + 0x20));
  return __return_storage_ptr__;
}

Assistant:

boost::numeric::ublas::vector<double> ESOINN::getCenterOfCluster(int classId)
{
    double density = -1;
    Vertex center;
    BGL_FORALL_VERTICES(v, graph, Graph) {
        if(graph[v].classId == classId && graph[v].density > density) {
            center = v;
            density = graph[center].density;
        }
    }
    return graph[center].weight;
}